

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::JUnitReporter(JUnitReporter *this,ContextOptions *co)

{
  IReporter in_RSI;
  ostream *in_RDI;
  XmlWriter *unaff_retaddr;
  JUnitTestCaseData *in_stack_ffffffffffffffe0;
  ostream *os;
  
  os = in_RDI;
  IReporter::IReporter((IReporter *)in_RDI);
  *(undefined ***)in_RDI = &PTR_report_query_001b3910;
  XmlWriter::XmlWriter(unaff_retaddr,os);
  std::mutex::mutex((mutex *)0x12d60a);
  detail::Timer::Timer((Timer *)(in_RDI + 0x78));
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
            ((vector<doctest::String,_std::allocator<doctest::String>_> *)0x12d627);
  JUnitTestCaseData::JUnitTestCaseData(in_stack_ffffffffffffffe0);
  *(_func_int ***)(in_RDI + 0xc0) = in_RSI._vptr_IReporter;
  *(_func_int ***)(in_RDI + 200) = (_func_int **)0x0;
  return;
}

Assistant:

JUnitReporter(const ContextOptions& co)
                : xml(*co.cout)
                , opt(co) {}